

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O0

uint8_t __thiscall MSX::AYPortHandler::get_port_input(AYPortHandler *this,bool port_b)

{
  byte bVar1;
  bool bVar2;
  reference this_00;
  Joystick *this_01;
  byte bVar3;
  bool port_b_local;
  AYPortHandler *this_local;
  
  if (port_b) {
    this_local._7_1_ = 0xff;
  }
  else {
    this_00 = std::
              vector<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
              ::operator[](&this->joysticks_,this->selected_joystick_);
    this_01 = (Joystick *)
              std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>::get
                        (this_00);
    bVar1 = Joystick::get_state(this_01);
    bVar2 = Storage::Tape::BinaryTapePlayer::get_input(this->tape_player_);
    bVar3 = 0x80;
    if (bVar2) {
      bVar3 = 0;
    }
    this_local._7_1_ = bVar1 & 0x3f | 0x40 | bVar3;
  }
  return this_local._7_1_;
}

Assistant:

uint8_t get_port_input(bool port_b) {
			if(!port_b) {
				// Bits 0-5: Joystick (up, down, left, right, A, B)
				// Bit 6: keyboard switch (not universal)
				// Bit 7: tape input
				return
					(static_cast<Joystick *>(joysticks_[selected_joystick_].get())->get_state() & 0x3f) |
					0x40 |
					(tape_player_.get_input() ? 0x00 : 0x80);
			}
			return 0xff;
		}